

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
::
Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
           *this,uint numberOfColumns,Column_settings *colSettings,
          function<bool_(unsigned_int,_unsigned_int)> *birthComparator,
          function<bool_(unsigned_int,_unsigned_int)> *deathComparator)

{
  function<bool_(unsigned_int,_unsigned_int)> local_70;
  function<bool_(unsigned_int,_unsigned_int)> local_50;
  
  Matrix_all_dimension_holder<int>::Matrix_all_dimension_holder
            ((Matrix_all_dimension_holder<int> *)this,-1);
  std::function<bool_(unsigned_int,_unsigned_int)>::function(&local_70,birthComparator);
  std::function<bool_(unsigned_int,_unsigned_int)>::function(&local_50,deathComparator);
  Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::Chain_vine_swap((Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
                     *)(this + 0x20),&local_70,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
    **)(this + 0x90) = this + 0xc0;
  *(undefined8 *)(this + 0x98) = 1;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined4 *)(this + 0xb0) = 0x3f800000;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
    **)(this + 200) = this + 0xf8;
  *(undefined8 *)(this + 0xd0) = 1;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined4 *)(this + 0xe8) = 0x3f800000;
  *(undefined4 *)(this + 0x100) = 0;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  *(Column_settings **)(this + 0x108) = colSettings;
  std::__detail::
  _Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)(this + 0x90),(ulong)numberOfColumns);
  std::__detail::
  _Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)(this + 200),(ulong)numberOfColumns);
  return;
}

Assistant:

inline Chain_matrix<Master_matrix>::Chain_matrix(unsigned int numberOfColumns,
                                                 Column_settings* colSettings,
                                                 const BirthComparatorFunction& birthComparator,
                                                 const DeathComparatorFunction& deathComparator)
    : Dim_opt(Master_matrix::template get_null_value<Dimension>()),
      Pair_opt(),
      Swap_opt(birthComparator, deathComparator),
      Rep_opt(),
      RA_opt(numberOfColumns),
      nextIndex_(0),
      colSettings_(colSettings)
{
  matrix_.reserve(numberOfColumns);
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.reserve(numberOfColumns);
  } else {
    pivotToColumnIndex_.resize(numberOfColumns, Master_matrix::template get_null_value<Index>());
  }
}